

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_replacement_incr(int eci,uchar *src,zueci_u32 len)

{
  int iVar1;
  zueci_u32 zVar2;
  
  iVar1 = 1;
  if (0x12 < eci && len != 1) {
    if ((uint)eci < 0x22) {
      if ((0x9e00000UL >> ((ulong)(uint)eci & 0x3f) & 1) != 0) {
        return 1;
      }
      if ((0x202000000U >> ((ulong)(uint)eci & 0x3f) & 1) != 0) {
        return 2;
      }
    }
    if (eci != 0xaa) {
      if ((eci & 0x7ffffffeU) == 0x22) {
        zVar2 = 4;
        if (len < 4) {
          zVar2 = len;
        }
        return zVar2;
      }
      if (((len < 4 || eci != 0x20) || (9 < (byte)(src[1] - 0x30))) ||
         (iVar1 = 4, 0x62 < (byte)(*src + 0x7f))) {
        return 2;
      }
    }
  }
  return iVar1;
}

Assistant:

static int zueci_replacement_incr(const int eci, const unsigned char *src, const zueci_u32 len) {
    assert(len);
    assert(eci != 26 && eci != 899); /* Dealt with as special cases */
    if (len == 1) { /* Last char */
        return 1;
    }
    if (eci <= 18 || (eci >= 21 && eci <= 24) || eci == 27 || eci == 170) { /* Single-byte */
        return 1;
    }
    if (eci == 25 || eci == 33) { /* UTF-16BE/LE */
        return 2;
    }
    if (eci == 34 || eci == 35) { /* UTF-32BE/LE */
        return ZUECI_MIN(len, 4);
    }
    if (eci == 32) { /* GB 18030 */
        /* If have 4 bytes and match start range of 4-byter [81..E3][30..39] */
        if (len >= 4 && src[1] <= 0x39 && src[1] >= 0x30 && src[0] >= 0x81 && src[0] <= 0xE3) {
            /* Treat as 4-byter (without checking further) */
            return 4;
        }
        /* Else treat as 2-byter */
    }
    return 2;
}